

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

void whisper_exp_compute_token_level_timestamps
               (whisper_context *ctx,whisper_state *state,int i_segment,float thold_pt,
               float thold_ptsum)

{
  ulong uVar1;
  int *piVar2;
  byte bVar3;
  pointer pfVar4;
  mapped_type *pmVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long *plVar12;
  bool bVar13;
  int iVar14;
  pointer pwVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  float *pfVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  float fVar29;
  float fVar30;
  int local_7c;
  int64_t local_78;
  ulong local_70;
  int64_t local_68;
  ulong local_60;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_70 = (ulong)((long)(state->energy).super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(state->energy).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  if ((int)local_70 == 0) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: no signal data available\n",
               "whisper_exp_compute_token_level_timestamps");
    return;
  }
  pwVar15 = (state->result_all).
            super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
            super__Vector_impl_data._M_start + i_segment;
  lVar21 = *(long *)&(pwVar15->tokens).
                     super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                     _M_impl.super__Vector_impl_data;
  uVar10 = (int)((long)*(pointer *)
                        ((long)&(pwVar15->tokens).
                                super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                                ._M_impl + 8) - lVar21 >> 3) * -0x49249249;
  if (uVar10 != 0) {
    local_68 = pwVar15->t0;
    local_78 = pwVar15->t1;
    if (uVar10 == 1) {
      *(int64_t *)(lVar21 + 0x18) = local_68;
      *(int64_t *)(lVar21 + 0x20) = local_78;
    }
    else {
      if (0 < (int)uVar10) {
        local_58 = &(ctx->vocab).id_to_token;
        local_60 = (ulong)(uVar10 & 0x7fffffff);
        uVar28 = 0;
        do {
          lVar21 = *(long *)&(pwVar15->tokens).
                             super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                             ._M_impl.super__Vector_impl_data;
          lVar18 = uVar28 * 0x38;
          piVar2 = (int *)(lVar21 + lVar18);
          if (uVar28 == 0) {
            iVar19 = (ctx->vocab).token_beg;
            if (*piVar2 == iVar19) {
              *(int64_t *)(piVar2 + 6) = local_68;
              *(int64_t *)(piVar2 + 8) = local_68;
              *(int64_t *)(lVar21 + 0x50) = local_68;
              state->t_beg = local_68;
              state->t_last = local_68;
              state->tid_last = iVar19;
            }
            else {
              *(int64_t *)(piVar2 + 6) = state->t_last;
            }
          }
          lVar21 = ((long)piVar2[1] - (long)(ctx->vocab).token_beg) * 2 + state->t_beg;
          local_7c = *piVar2;
          pmVar5 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at(local_58,(key_type *)&local_7c);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,(pmVar5->_M_dataplus)._M_p,(allocator<char> *)&local_7c);
          fVar29 = 0.0;
          if (local_48 != 0) {
            lVar7 = 0;
            fVar29 = 0.0;
            do {
              bVar3 = *(byte *)((long)local_50 + lVar7);
              if (bVar3 < 0x2c) {
                fVar30 = 0.01;
                if (bVar3 != 0x20) {
                  if (bVar3 != 0x21) goto LAB_0013acb4;
                  goto LAB_0013acaf;
                }
              }
              else if ((bVar3 == 0x3f) || (bVar3 == 0x2e)) {
LAB_0013acaf:
                fVar30 = 3.0;
              }
              else if (bVar3 == 0x2c) {
                fVar30 = 2.0;
              }
              else {
LAB_0013acb4:
                fVar30 = *(float *)(&DAT_0015a288 + (ulong)((byte)(bVar3 - 0x30) < 10) * 4);
              }
              fVar29 = fVar29 + fVar30;
              lVar7 = lVar7 + 1;
            } while (local_48 != lVar7);
          }
          *(float *)(*(long *)&(pwVar15->tokens).
                               super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                               ._M_impl.super__Vector_impl_data + 0x30 + lVar18) = fVar29;
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          if ((((thold_pt < (float)piVar2[4]) && (thold_ptsum < (float)piVar2[5])) &&
              (iVar19 = piVar2[1], state->tid_last < iVar19)) && (lVar21 <= local_78)) {
            if (uVar28 != 0) {
              *(long *)(*(long *)&(pwVar15->tokens).
                                  super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                                  ._M_impl.super__Vector_impl_data + -0x18 + lVar18) = lVar21;
            }
            *(long *)(*(long *)&(pwVar15->tokens).
                                super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                                ._M_impl.super__Vector_impl_data + 0x18 + lVar18) = lVar21;
            state->tid_last = iVar19;
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != local_60);
      }
      lVar21 = *(long *)&(pwVar15->tokens).
                         super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                         ._M_impl.super__Vector_impl_data;
      *(int64_t *)(lVar21 + 0x20 + (long)(int)(uVar10 - 2) * 0x38) = local_78;
      uVar11 = uVar10 - 1;
      lVar18 = (long)(int)uVar11 * 0x38;
      *(int64_t *)(lVar21 + 0x18 + lVar18) = local_78;
      *(int64_t *)(lVar21 + 0x20 + lVar18) = local_78;
      state->t_last = local_78;
      uVar20 = 0;
      do {
        lVar18 = (long)(int)uVar20;
        bVar13 = (int)uVar10 <= (int)uVar20;
        uVar26 = uVar20;
        if (((int)uVar20 < (int)uVar10) && (*(long *)(lVar21 + 0x20 + lVar18 * 0x38) < 0)) {
          plVar12 = (long *)(lVar18 * 0x38 + lVar21 + 0x58);
          lVar7 = 0;
          do {
            if ((1 - (long)(int)uVar10) + lVar18 == lVar7) {
              bVar13 = true;
              uVar26 = uVar10;
              goto LAB_0013ae08;
            }
            lVar7 = lVar7 + -1;
            lVar17 = *plVar12;
            plVar12 = plVar12 + 7;
          } while (lVar17 < 0);
          bVar13 = (long)(int)uVar10 <= lVar18 - lVar7;
          uVar26 = uVar20 - (int)lVar7;
        }
LAB_0013ae08:
        iVar19 = uVar26 - bVar13;
        if ((int)uVar20 < iVar19) {
          uVar25 = -(uint)bVar13;
          pfVar22 = (float *)(lVar21 + 0x30 + lVar18 * 0x38);
          iVar14 = ((uVar26 + uVar25) - uVar20) + 1;
          fVar29 = 0.0;
          do {
            fVar29 = fVar29 + *pfVar22;
            pfVar22 = pfVar22 + 0xe;
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
          lVar7 = *(long *)(lVar21 + 0x20 + (long)iVar19 * 0x38);
          plVar12 = (long *)(lVar21 + lVar18 * 0x38 + 0x18);
          lVar17 = *plVar12;
          lVar18 = ((long)(int)uVar26 - (ulong)(uVar25 & 1)) - lVar18;
          do {
            lVar8 = (long)((*(float *)(plVar12 + 3) * (float)(lVar7 - lVar17)) / fVar29 +
                          (float)*plVar12);
            plVar12[1] = lVar8;
            plVar12[7] = lVar8;
            plVar12 = plVar12 + 7;
            lVar18 = lVar18 + -1;
          } while (lVar18 != 0);
        }
        uVar20 = iVar19 + 1;
      } while ((int)uVar20 < (int)uVar10);
      if (1 < (int)uVar10) {
        plVar12 = (long *)(lVar21 + -0x18);
        uVar28 = 0;
        do {
          if (plVar12[7] < 0) {
            plVar12[0xd] = plVar12[7];
          }
          if ((uVar28 != 0) && (lVar18 = *plVar12, plVar12[6] < lVar18)) {
            plVar12[6] = lVar18;
            lVar7 = plVar12[7];
            if (plVar12[7] < lVar18) {
              lVar7 = lVar18;
            }
            plVar12[7] = lVar7;
          }
          uVar28 = uVar28 + 1;
          plVar12 = plVar12 + 7;
        } while (uVar11 != uVar28);
      }
      if (0 < (int)uVar10) {
        iVar19 = (int)local_70;
        uVar20 = iVar19 - 1;
        uVar28 = 0;
        do {
          lVar18 = uVar28 * 0x38;
          if (*(int *)(lVar21 + lVar18) < (ctx->vocab).token_eot) {
            lVar7 = lVar21 + lVar18;
            uVar26 = *(int *)(lVar7 + 0x18) * 0xa0;
            if ((int)uVar20 <= (int)uVar26) {
              uVar26 = uVar20;
            }
            uVar25 = 0;
            if (0 < (int)uVar26) {
              uVar25 = uVar26;
            }
            uVar27 = *(int *)(lVar7 + 0x20) * 0xa0;
            if ((int)uVar20 <= (int)uVar27) {
              uVar27 = uVar20;
            }
            uVar24 = 0;
            if (0 < (int)uVar27) {
              uVar24 = (ulong)uVar27;
            }
            uVar16 = 2000;
            if (2000 < (int)uVar26) {
              uVar16 = uVar26;
            }
            iVar14 = (int)uVar24 + 2000;
            if (iVar19 <= iVar14) {
              iVar14 = iVar19;
            }
            fVar29 = 0.0;
            iVar6 = iVar14 - (uVar16 - 2000);
            if (iVar6 != 0 && (int)(uVar16 - 2000) <= iVar14) {
              lVar17 = (ulong)uVar16 - 2000;
              fVar29 = 0.0;
              do {
                fVar29 = fVar29 + (state->energy).super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar17];
                lVar17 = lVar17 + 1;
              } while (iVar14 != lVar17);
              fVar29 = fVar29 * 0.5;
            }
            fVar29 = fVar29 / (float)iVar6;
            uVar23 = (ulong)uVar25;
            pfVar4 = (state->energy).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((uVar28 == 0) || (pfVar4[uVar23] <= fVar29)) {
              do {
                uVar1 = uVar23 + 1;
                if ((long)(int)uVar27 <= (long)uVar23) break;
                pfVar22 = pfVar4 + uVar23;
                uVar23 = uVar1;
              } while (*pfVar22 <= fVar29 && fVar29 != *pfVar22);
              uVar27 = (int)uVar1 - 1;
              *(ulong *)(lVar7 + 0x18) = (ulong)uVar27 / 0xa0;
            }
            else {
              uVar27 = uVar25;
              if (0 < (int)uVar26) {
                do {
                  if (pfVar4[uVar23] <= fVar29) {
                    uVar27 = (uint)uVar23;
                    goto LAB_0013b072;
                  }
                  bVar13 = 1 < (long)uVar23;
                  uVar23 = uVar23 - 1;
                } while (bVar13);
                uVar27 = 0;
              }
LAB_0013b072:
              lVar9 = (long)((int)uVar27 / 0xa0);
              *(long *)(lVar7 + 0x18) = lVar9;
              lVar17 = *(long *)(lVar21 + -0x18 + lVar18);
              lVar8 = lVar9;
              if (lVar9 < lVar17) {
                lVar8 = lVar17;
              }
              *(long *)(lVar7 + 0x18) = lVar8;
              if (lVar9 < lVar17) {
                uVar27 = uVar25;
              }
            }
            if (pfVar4[uVar24] <= fVar29) {
              do {
                uVar23 = uVar24 - 1;
                if ((long)uVar24 <= (long)(int)uVar27) break;
                pfVar22 = pfVar4 + uVar24;
                uVar24 = uVar23;
              } while (*pfVar22 <= fVar29 && fVar29 != *pfVar22);
              lVar18 = (long)(((int)uVar23 + 1) / 0xa0);
            }
            else {
              if ((int)uVar24 < (int)uVar20) {
                do {
                  if (pfVar4[uVar24] <= fVar29) {
                    uVar24 = uVar24 & 0xffffffff;
                    goto LAB_0013b10d;
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar20 != uVar24);
                uVar24 = (ulong)uVar20;
              }
LAB_0013b10d:
              *(ulong *)(lVar7 + 0x20) = uVar24 / 0xa0;
              if (((long)(int)uVar11 <= (long)uVar28) ||
                 (lVar18 = *(long *)(lVar21 + 0x50 + lVar18), (long)(uVar24 / 0xa0) <= lVar18))
              goto LAB_0013b139;
            }
            *(long *)(lVar7 + 0x20) = lVar18;
          }
LAB_0013b139:
          uVar28 = uVar28 + 1;
        } while (uVar28 != (uVar10 & 0x7fffffff));
      }
    }
  }
  return;
}

Assistant:

static void whisper_exp_compute_token_level_timestamps(
        struct whisper_context & ctx,
          struct whisper_state & state,
                           int   i_segment,
                         float   thold_pt,
                         float   thold_ptsum) {
    auto & segment = state.result_all[i_segment];
    auto & tokens  = segment.tokens;

    const int n_samples = state.energy.size();

    if (n_samples == 0) {
        WHISPER_LOG_ERROR("%s: no signal data available\n", __func__);
        return;
    }

    const int64_t t0 = segment.t0;
    const int64_t t1 = segment.t1;

    const int n = tokens.size();

    if (n == 0) {
        return;
    }

    if (n == 1) {
        tokens[0].t0 = t0;
        tokens[0].t1 = t1;

        return;
    }

    auto & t_beg    = state.t_beg;
    auto & t_last   = state.t_last;
    auto & tid_last = state.tid_last;

    for (int j = 0; j < n; ++j) {
        auto & token = tokens[j];

        if (j == 0) {
            if (token.id == whisper_token_beg(&ctx)) {
                tokens[j    ].t0 = t0;
                tokens[j    ].t1 = t0;
                tokens[j + 1].t0 = t0;

                t_beg    = t0;
                t_last   = t0;
                tid_last = whisper_token_beg(&ctx);
            } else {
                tokens[j    ].t0 = t_last;
            }
        }

        const int64_t tt = t_beg + 2*(token.tid - whisper_token_beg(&ctx));

        tokens[j].id    = token.id;
        tokens[j].tid   = token.tid;
        tokens[j].p     = token.p;
        tokens[j].pt    = token.pt;
        tokens[j].ptsum = token.ptsum;

        tokens[j].vlen = voice_length(whisper_token_to_str(&ctx, token.id));

        if (token.pt > thold_pt && token.ptsum > thold_ptsum && token.tid > tid_last && tt <= t1) {
            if (j > 0) {
                tokens[j - 1].t1 = tt;
            }
            tokens[j].t0 = tt;
            tid_last = token.tid;
        }
    }

    tokens[n - 2].t1 = t1;
    tokens[n - 1].t0 = t1;
    tokens[n - 1].t1 = t1;

    t_last = t1;

    // find intervals of tokens with unknown timestamps
    // fill the timestamps by proportionally splitting the interval based on the token voice lengths
    {
        int p0 = 0;
        int p1 = 0;

        while (true) {
            while (p1 < n && tokens[p1].t1 < 0) {
                p1++;
            }

            if (p1 >= n) {
                p1--;
            }

            //printf("p0=%d p1=%d t0=%lld t1=%lld\n", p0, p1, tokens[p0].t0, tokens[p1].t1);

            if (p1 > p0) {
                double psum = 0.0;
                for (int j = p0; j <= p1; j++) {
                    psum += tokens[j].vlen;
                }

                //printf("analyzing %d - %d, psum = %f\n", p0, p1, psum);

                const double dt = tokens[p1].t1 - tokens[p0].t0;

                // split the time proportionally to the voice length
                for (int j = p0 + 1; j <= p1; j++) {
                    const double ct = tokens[j - 1].t0 + dt*tokens[j - 1].vlen/psum;

                    tokens[j - 1].t1 = ct;
                    tokens[j    ].t0 = ct;
                }
            }

            p1++;
            p0 = p1;
            if (p1 >= n) {
                break;
            }
        }
    }

    // fix up (just in case)
    for (int j = 0; j < n - 1; j++) {
        if (tokens[j].t1 < 0) {
            tokens[j + 1].t0 = tokens[j].t1;
        }

        if (j > 0) {
            if (tokens[j - 1].t1 > tokens[j].t0) {
                tokens[j].t0 = tokens[j - 1].t1;
                tokens[j].t1 = std::max(tokens[j].t0, tokens[j].t1);
            }
        }
    }

    // VAD
    // expand or contract tokens based on voice activity
    {
        const int hw = WHISPER_SAMPLE_RATE/8;

        for (int j = 0; j < n; j++) {
            if (tokens[j].id >= whisper_token_eot(&ctx)) {
                continue;
            }

            int s0 = timestamp_to_sample(tokens[j].t0, n_samples);
            int s1 = timestamp_to_sample(tokens[j].t1, n_samples);

            const int ss0 = std::max(s0 - hw, 0);
            const int ss1 = std::min(s1 + hw, n_samples);

            const int ns = ss1 - ss0;

            float sum = 0.0f;

            for (int k = ss0; k < ss1; k++) {
                sum += state.energy[k];
            }

            const float thold = 0.5*sum/ns;

            {
                int k = s0;
                if (state.energy[k] > thold && j > 0) {
                    while (k > 0 && state.energy[k] > thold) {
                        k--;
                    }
                    tokens[j].t0 = sample_to_timestamp(k);
                    if (tokens[j].t0 < tokens[j - 1].t1) {
                        tokens[j].t0 = tokens[j - 1].t1;
                    } else {
                        s0 = k;
                    }
                } else {
                    while (state.energy[k] < thold && k < s1) {
                        k++;
                    }
                    s0 = k;
                    tokens[j].t0 = sample_to_timestamp(k);
                }
            }

            {
                int k = s1;
                if (state.energy[k] > thold) {
                    while (k < n_samples - 1 && state.energy[k] > thold) {
                        k++;
                    }
                    tokens[j].t1 = sample_to_timestamp(k);
                    if (j < n - 1 && tokens[j].t1 > tokens[j + 1].t0) {
                        tokens[j].t1 = tokens[j + 1].t0;
                    } else {
                        s1 = k;
                    }
                } else {
                    while (state.energy[k] < thold && k > s0) {
                        k--;
                    }
                    s1 = k;
                    tokens[j].t1 = sample_to_timestamp(k);
                }
            }
        }
    }

    // fixed token expand (optional)
    //{
    //    const int t_expand = 0;

    //    for (int j = 0; j < n; j++) {
    //        if (j > 0) {
    //            tokens[j].t0 = std::max(0, (int) (tokens[j].t0 - t_expand));
    //        }
    //        if (j < n - 1) {
    //            tokens[j].t1 = tokens[j].t1 + t_expand;
    //        }
    //    }
    //}

    // debug info
    //for (int j = 0; j < n; ++j) {
    //    const auto & token = tokens[j];
    //    const auto tt = token.pt > thold_pt && token.ptsum > 0.01 ? whisper_token_to_str(&ctx, token.tid) : "[?]";
    //    printf("%s: %10s %6.3f %6.3f %6.3f %6.3f %5d %5d '%s'\n", __func__,
    //            tt, token.p, token.pt, token.ptsum, token.vlen, (int) token.t0, (int) token.t1, whisper_token_to_str(&ctx, token.id));

    //    if (tokens[j].id >= whisper_token_eot(&ctx)) {
    //        continue;
    //    }
    //}
}